

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

void __thiscall ary::PlaneTracker::~PlaneTracker(PlaneTracker *this)

{
  pointer pPVar1;
  pointer puVar2;
  pointer pPVar3;
  
  (this->super_CameraUser)._vptr_CameraUser = (_func_int **)&PTR__PlaneTracker_00126938;
  pPVar1 = (this->plane_corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  cv::Mat::~Mat(&this->errors);
  puVar2 = (this->status).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  cv::Mat::~Mat(&this->mask);
  cv::Mat::~Mat(&this->previous);
  pPVar1 = (this->keypoints_current).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1 != (pointer)0x0) {
    operator_delete(pPVar1);
  }
  pPVar3 = (this->keypoints_start).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar3 != (pointer)0x0) {
    operator_delete(pPVar3);
  }
  CameraUser::~CameraUser(&this->super_CameraUser);
  return;
}

Assistant:

PlaneTracker::~PlaneTracker() {

}